

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claqgs.c
# Opt level: O0

void claqgs(SuperMatrix *A,float *r,float *c,float rowcnd,float colcnd,float amax,char *equed)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float temp;
  float cj;
  float small;
  float large;
  int irow;
  int_t j;
  int_t i;
  singlecomplex *Aval;
  NCformat *Astore;
  char *equed_local;
  float amax_local;
  float colcnd_local;
  float rowcnd_local;
  float *c_local;
  float *r_local;
  SuperMatrix *A_local;
  
  if ((A->nrow < 1) || (A->ncol < 1)) {
    *equed = 'N';
  }
  else {
    pvVar2 = A->Store;
    lVar3 = *(long *)((long)pvVar2 + 8);
    fVar4 = smach("Safe minimum");
    fVar5 = smach("Precision");
    if (((rowcnd < 0.1) || (amax < fVar4 / fVar5)) || (1.0 / (fVar4 / fVar5) < amax)) {
      if (colcnd < 0.1) {
        for (large = 0.0; (int)large < A->ncol; large = (float)((int)large + 1)) {
          fVar4 = c[(int)large];
          for (irow = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)(int)large * 4);
              irow < *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)((int)large + 1) * 4);
              irow = irow + 1) {
            fVar5 = r[*(int *)(*(long *)((long)pvVar2 + 0x10) + (long)irow * 4)];
            *(float *)(lVar3 + (long)irow * 8) = *(float *)(lVar3 + (long)irow * 8) * fVar4 * fVar5;
            *(float *)(lVar3 + 4 + (long)irow * 8) =
                 *(float *)(lVar3 + 4 + (long)irow * 8) * fVar4 * fVar5;
          }
        }
        *equed = 'B';
      }
      else {
        for (large = 0.0; (int)large < A->ncol; large = (float)((int)large + 1)) {
          for (irow = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)(int)large * 4);
              irow < *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)((int)large + 1) * 4);
              irow = irow + 1) {
            iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)irow * 4);
            *(float *)(lVar3 + (long)irow * 8) = *(float *)(lVar3 + (long)irow * 8) * r[iVar1];
            *(float *)(lVar3 + 4 + (long)irow * 8) =
                 *(float *)(lVar3 + 4 + (long)irow * 8) * r[iVar1];
          }
        }
        *equed = 'R';
      }
    }
    else if (colcnd < 0.1) {
      for (large = 0.0; (int)large < A->ncol; large = (float)((int)large + 1)) {
        fVar4 = c[(int)large];
        for (irow = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)(int)large * 4);
            irow < *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)((int)large + 1) * 4);
            irow = irow + 1) {
          *(float *)(lVar3 + (long)irow * 8) = *(float *)(lVar3 + (long)irow * 8) * fVar4;
          *(float *)(lVar3 + 4 + (long)irow * 8) = *(float *)(lVar3 + 4 + (long)irow * 8) * fVar4;
        }
      }
      *equed = 'C';
    }
    else {
      *equed = 'N';
    }
  }
  return;
}

Assistant:

void
claqgs(SuperMatrix *A, float *r, float *c, 
	float rowcnd, float colcnd, float amax, char *equed)
{


#define THRESH    (0.1)
    
    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int_t i, j;
    int   irow;
    float large, small, cj;
    float temp;


    /* Quick return if possible */
    if (A->nrow <= 0 || A->ncol <= 0) {
	*(unsigned char *)equed = 'N';
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Initialize LARGE and SMALL. */
    small = smach("Safe minimum") / smach("Precision");
    large = 1. / small;

    if (rowcnd >= THRESH && amax >= small && amax <= large) {
	if (colcnd >= THRESH)
	    *(unsigned char *)equed = 'N';
	else {
	    /* Column scaling */
	    for (j = 0; j < A->ncol; ++j) {
		cj = c[j];
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    cs_mult(&Aval[i], &Aval[i], cj);
                }
	    }
	    *(unsigned char *)equed = 'C';
	}
    } else if (colcnd >= THRESH) {
	/* Row scaling, no column scaling */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		cs_mult(&Aval[i], &Aval[i], r[irow]);
	    }
	*(unsigned char *)equed = 'R';
    } else {
	/* Row and column scaling */
	for (j = 0; j < A->ncol; ++j) {
	    cj = c[j];
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		temp = cj * r[irow];
		cs_mult(&Aval[i], &Aval[i], temp);
	    }
	}
	*(unsigned char *)equed = 'B';
    }

    return;

}